

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O0

void polynomial_mod(field_t field,polynomial_t dividend,polynomial_t divisor,polynomial_t mod)

{
  field_logarithm_t r;
  field_t field_00;
  field_t field_01;
  field_t field_02;
  field_logarithm_t r_00;
  field_element_t r_01;
  field_element_t fVar1;
  uint in_ECX;
  void *in_RDX;
  field_logarithm_t *in_RSI;
  field_element_t *in_RDI;
  long in_R8;
  uint in_R9D;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint j;
  field_logarithm_t q_coeff;
  uint q_order;
  uint i;
  field_logarithm_t divisor_leading;
  uint local_44;
  uint local_38;
  
  if (in_ECX <= in_stack_00000010) {
    memcpy(in_stack_00000008,in_RDX,(ulong)(in_ECX + 1));
    r = in_RSI[*(byte *)(in_R8 + (ulong)in_R9D)];
    for (local_38 = in_ECX; (local_38 != 0 && (in_R9D <= local_38)); local_38 = local_38 - 1) {
      if (*(char *)((long)in_stack_00000008 + (ulong)local_38) != '\0') {
        field_00.log = in_RSI;
        field_00.exp = in_RDI;
        r_00 = field_div_log(field_00,in_RSI[*(byte *)((long)in_stack_00000008 + (ulong)local_38)],r
                            );
        for (local_44 = 0; local_44 <= in_R9D; local_44 = local_44 + 1) {
          if (*(char *)(in_R8 + (ulong)local_44) != '\0') {
            fVar1 = *(field_element_t *)
                     ((long)in_stack_00000008 + (ulong)(local_44 + (local_38 - in_R9D)));
            field_01.log = in_RSI;
            field_01.exp = in_RDI;
            r_01 = field_mul_log_element(field_01,in_RSI[*(byte *)(in_R8 + (ulong)local_44)],r_00);
            field_02.log = in_RSI;
            field_02.exp = in_RDI;
            fVar1 = field_add(field_02,fVar1,r_01);
            *(field_element_t *)((long)in_stack_00000008 + (ulong)(local_44 + (local_38 - in_R9D)))
                 = fVar1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void polynomial_mod(field_t field, polynomial_t dividend, polynomial_t divisor, polynomial_t mod) {
    // find the polynomial remainder of dividend mod divisor
    // do long division and return just the remainder (written to mod)

    if (mod.order < dividend.order) {
        // mod.order must be >= dividend.order (scratch space needed)
        // this is an error -- catch it in debug?
        return;
    }
    // initialize remainder as dividend
    memcpy(mod.coeff, dividend.coeff, sizeof(field_element_t) * (dividend.order + 1));

    // XXX make sure divisor[divisor_order] is nonzero
    field_logarithm_t divisor_leading = field.log[divisor.coeff[divisor.order]];
    // long division steps along one order at a time, starting at the highest order
    for (unsigned int i = dividend.order; i > 0; i--) {
        // look at the leading coefficient of dividend and divisor
        // if leading coefficient of dividend / leading coefficient of divisor is q
        //   then the next row of subtraction will be q * divisor
        // if order of q < 0 then what we have is the remainder and we are done
        if (i < divisor.order) {
            break;
        }
        if (mod.coeff[i] == 0) {
            continue;
        }
        unsigned int q_order = i - divisor.order;
        field_logarithm_t q_coeff = field_div_log(field, field.log[mod.coeff[i]], divisor_leading);

        // now that we've chosen q, multiply the divisor by q and subtract from
        //   our remainder. subtracting in GF(2^8) is XOR, just like addition
        for (unsigned int j = 0; j <= divisor.order; j++) {
            if (divisor.coeff[j] == 0) {
                continue;
            }
            // all of the multiplication is shifted up by q_order places
            mod.coeff[j + q_order] = field_add(field, mod.coeff[j + q_order],
                        field_mul_log_element(field, field.log[divisor.coeff[j]], q_coeff));
        }
    }
}